

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterYs<unsigned_int>,ImPlot::TransformerLogLog>
               (GetterYs<unsigned_int> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  ImPlotPlot *pIVar7;
  float fVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  ImDrawList *this;
  int iVar11;
  int iVar12;
  ImPlotContext *gp;
  float fVar13;
  double dVar14;
  double dVar15;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar9 = GImPlot;
  pIVar7 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar7->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar11 = getter->Count;
    local_48 = iVar11 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    uVar6 = *(uint *)((long)getter->Ys +
                     (long)((getter->Offset % iVar11 + iVar11) % iVar11) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar14 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar7->XAxis).Range.Min);
    dVar2 = pIVar9->LogDenX;
    pIVar7 = pIVar9->CurrentPlot;
    dVar3 = (pIVar7->XAxis).Range.Min;
    dVar4 = (pIVar7->XAxis).Range.Max;
    dVar15 = log10((double)uVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar11 = transformer->YAxis;
    pIVar7 = pIVar9->CurrentPlot;
    dVar5 = pIVar7->YAxis[iVar11].Range.Min;
    local_3c.x = (float)((((double)(float)(dVar14 / dVar2) * (dVar4 - dVar3) + dVar3) -
                         (pIVar7->XAxis).Range.Min) * pIVar9->Mx +
                        (double)pIVar9->PixelRange[iVar11].Min.x);
    local_3c.y = (float)((((double)(float)(dVar15 / pIVar9->LogDenY[iVar11]) *
                           (pIVar7->YAxis[iVar11].Range.Max - dVar5) + dVar5) - dVar5) *
                         pIVar9->My[iVar11] + (double)pIVar9->PixelRange[iVar11].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::TransformerLogLog>>
              ((StairsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::TransformerLogLog> *)local_58
               ,local_60,&pIVar7->PlotRect);
  }
  else {
    iVar11 = getter->Count;
    uVar6 = *(uint *)((long)getter->Ys +
                     (long)((getter->Offset % iVar11 + iVar11) % iVar11) * (long)getter->Stride);
    dVar14 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar7->XAxis).Range.Min);
    dVar2 = pIVar9->LogDenX;
    pIVar7 = pIVar9->CurrentPlot;
    dVar3 = (pIVar7->XAxis).Range.Min;
    dVar4 = (pIVar7->XAxis).Range.Max;
    dVar15 = log10((double)uVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar11 = transformer->YAxis;
    pIVar7 = pIVar9->CurrentPlot;
    dVar5 = pIVar7->YAxis[iVar11].Range.Min;
    local_58._0_4_ =
         (undefined4)
         ((((double)(float)(dVar14 / dVar2) * (dVar4 - dVar3) + dVar3) - (pIVar7->XAxis).Range.Min)
          * pIVar9->Mx + (double)pIVar9->PixelRange[iVar11].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar15 / pIVar9->LogDenY[iVar11]) *
                   (pIVar7->YAxis[iVar11].Range.Max - dVar5) + dVar5) - dVar5) * pIVar9->My[iVar11]
                + (double)pIVar9->PixelRange[iVar11].Min.y);
    iVar11 = getter->Count;
    if (1 < iVar11) {
      iVar12 = 1;
      do {
        pIVar10 = GImPlot;
        uVar6 = *(uint *)((long)getter->Ys +
                         (long)(((getter->Offset + iVar12) % iVar11 + iVar11) % iVar11) *
                         (long)getter->Stride);
        dVar14 = log10(((double)iVar12 * getter->XScale + getter->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar2 = pIVar10->LogDenX;
        pIVar7 = pIVar10->CurrentPlot;
        dVar3 = (pIVar7->XAxis).Range.Min;
        dVar4 = (pIVar7->XAxis).Range.Max;
        dVar15 = log10((double)uVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
        this = local_60;
        iVar11 = transformer->YAxis;
        pIVar7 = pIVar10->CurrentPlot;
        dVar5 = pIVar7->YAxis[iVar11].Range.Min;
        local_70.x = (float)((((double)(float)(dVar14 / dVar2) * (dVar4 - dVar3) + dVar3) -
                             (pIVar7->XAxis).Range.Min) * pIVar10->Mx +
                            (double)pIVar10->PixelRange[iVar11].Min.x);
        fVar13 = (float)((((double)(float)(dVar15 / pIVar10->LogDenY[iVar11]) *
                           (pIVar7->YAxis[iVar11].Range.Max - dVar5) + dVar5) - dVar5) *
                         pIVar10->My[iVar11] + (double)pIVar10->PixelRange[iVar11].Min.y);
        local_70.y = fVar13;
        pIVar7 = pIVar9->CurrentPlot;
        fVar8 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar8 = fVar13;
        }
        if ((fVar8 < (pIVar7->PlotRect).Max.y) &&
           (fVar8 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                           -(uint)(fVar13 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar8 && fVar8 != *pfVar1)) {
          fVar8 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar8 = local_70.x;
          }
          if ((fVar8 < (pIVar7->PlotRect).Max.x) &&
             (fVar8 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar7->PlotRect).Min.x <= fVar8 && fVar8 != (pIVar7->PlotRect).Min.x)) {
            local_68.y = (float)local_58._4_4_;
            local_68.x = local_70.x;
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
            ImDrawList::AddLine(this,&local_68,&local_70,col,line_weight);
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar12 = iVar12 + 1;
        iVar11 = getter->Count;
      } while (iVar12 < iVar11);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}